

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::writeTestFile
          (SonarQubeReporter *this,StringRef filename,
          vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
          *testCaseNodes)

{
  pointer ppNVar1;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> **child;
  pointer ppNVar2;
  StringRef name;
  ScopedElement e;
  long *local_60 [2];
  long local_50 [2];
  
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"file","");
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)&this->xml,(XmlFormatting)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  name.m_size = 4;
  name.m_start = "path";
  XmlWriter::writeAttribute(&this->xml,name,filename);
  ppNVar1 = (testCaseNodes->
            super__Vector_base<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar2 = (testCaseNodes->
                 super__Vector_base<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
      ppNVar2 = ppNVar2 + 1) {
    writeTestCase(this,*ppNVar2);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void SonarQubeReporter::writeTestFile(StringRef filename, std::vector<TestCaseNode const*> const& testCaseNodes) {
        XmlWriter::ScopedElement e = xml.scopedElement("file");
        xml.writeAttribute("path"_sr, filename);

        for (auto const& child : testCaseNodes)
            writeTestCase(*child);
    }